

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O0

int __thiscall
Inter_Symbol_Generator::LDPC_Matrix_Generator(Inter_Symbol_Generator *this,Array_Data_Symbol *p)

{
  uint8_t **ppuVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  uint local_24;
  int i;
  uint32_t b;
  uint32_t a;
  Array_Data_Symbol *p_local;
  Inter_Symbol_Generator *this_local;
  
  ppuVar1 = new_matrix(this,p->S,p->K);
  this->G_LDPC = ppuVar1;
  for (local_24 = 0; local_24 < p->K; local_24 = local_24 + 1) {
    dVar4 = floor((double)((ulong)local_24 / (ulong)p->S));
    iVar2 = (int)(((long)dVar4 & 0xffffffffU) % (ulong)(p->S - 1)) + 1;
    uVar3 = local_24 % p->S;
    this->G_LDPC[uVar3][(int)local_24] = '\x01';
    uVar3 = (uVar3 + iVar2) % p->S;
    this->G_LDPC[uVar3][(int)local_24] = '\x01';
    this->G_LDPC[(uVar3 + iVar2) % p->S][(int)local_24] = '\x01';
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::LDPC_Matrix_Generator(class Array_Data_Symbol *p)
{

	uint32_t a = 0;
	uint32_t b = 0;

	// G_LDPC = new uint8_t* [p->S]; 

	// for (int i = 0; i < p->S; i++)
	// {
	// 	G_LDPC[i] = new uint8_t[p->K];
	// }


	// for (int i = 0; i < p->S; i++)
	// {
	// 	for (int j = 0; j < p->K; j++)
	// 	{
	// 		G_LDPC[i][j] = 0;
	// 	}
	// }

	G_LDPC = new_matrix(p->S, p->K);


	for (int i = 0; i < p->K; i++)
	{
		a = 1 + ((uint32_t)floor( (double)(i / p->S)) % (p->S - 1));
		b = i % p->S;
		G_LDPC[b][i] = 1;
		b = (b + a) % p->S;
		G_LDPC[b][i] = 1;
		b = (b + a) % p->S;
		G_LDPC[b][i] = 1;		

	}


	return 0;
}